

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::RsCaseSyntax::RsCaseSyntax
          (RsCaseSyntax *this,Token keyword,Token openParen,ExpressionSyntax *expr,Token closeParen,
          SyntaxList<slang::syntax::RsCaseItemSyntax> *items,Token endcase)

{
  undefined4 uVar1;
  bool bVar2;
  ExpressionSyntax *pEVar3;
  reference ppRVar4;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  ExpressionSyntax *in_R9;
  RsCaseItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *__range2;
  undefined4 in_stack_ffffffffffffff88;
  SyntaxKind in_stack_ffffffffffffff8c;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *this_00;
  span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *this_01;
  __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
  local_48;
  SyntaxNode **local_40;
  ExpressionSyntax *local_38;
  ExpressionSyntax *local_30;
  SyntaxNode *local_20;
  undefined8 local_18;
  undefined8 local_10;
  SyntaxNode *local_8;
  
  this_01 = (span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)&child;
  this_00 = (SyntaxList<slang::syntax::RsCaseItemSyntax> *)&stack0x00000008;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_R8;
  local_10 = in_RSI;
  local_8 = in_RDX;
  RsProdSyntax::RsProdSyntax((RsProdSyntax *)this_00,in_stack_ffffffffffffff8c);
  *(undefined8 *)(in_RDI + 1) = local_10;
  in_RDI[1].parent = local_8;
  in_RDI[1].previewNode = local_20;
  *(undefined8 *)(in_RDI + 2) = local_18;
  local_38 = local_30;
  not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
            ((not_null<slang::syntax::ExpressionSyntax_*> *)&in_RDI[2].parent,&local_38);
  in_RDI[2].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[3].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[3].field_0x4 = uVar1;
  SyntaxList<slang::syntax::RsCaseItemSyntax>::SyntaxList
            (this_00,(SyntaxList<slang::syntax::RsCaseItemSyntax> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  in_RDI[5].previewNode = (SyntaxNode *)this_01->_M_ptr;
  *(size_t *)(in_RDI + 6) = (this_01->_M_extent)._M_extent_value;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0x42d9bb);
  (pEVar3->super_SyntaxNode).parent = in_RDI;
  *(SyntaxNode **)(in_RDI + 4) = in_RDI;
  local_40 = &in_RDI[3].parent;
  local_48._M_current =
       (RsCaseItemSyntax **)
       std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppRVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_48);
    ((*ppRVar4)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

RsCaseSyntax(Token keyword, Token openParen, ExpressionSyntax& expr, Token closeParen, const SyntaxList<RsCaseItemSyntax>& items, Token endcase) :
        RsProdSyntax(SyntaxKind::RsCase), keyword(keyword), openParen(openParen), expr(&expr), closeParen(closeParen), items(items), endcase(endcase) {
        this->expr->parent = this;
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }